

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O0

void stackjit::ByteCodeGenerator::generateFunction(ostream *stream,Function *function)

{
  Function *pFVar1;
  bool bVar2;
  InstructionFormats IVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  AttributeContainer *attributes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  size_type sVar9;
  void *this;
  reference pbVar10;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *this_00;
  reference this_01;
  mapped_type *pmVar11;
  string *psVar12;
  float fVar13;
  string local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameter_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_1;
  string local_1b8 [7];
  bool isFirst_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameter;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  string local_178 [7];
  bool isFirst;
  ByteCodeGenerator local_158 [32];
  char *local_138;
  char *local_130;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  OpCodes local_111;
  string local_110 [8];
  mapped_type opCode;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  size_t i;
  Loader local_88 [32];
  undefined1 local_68 [80];
  Function *local_18;
  Function *function_local;
  ostream *stream_local;
  
  local_18 = function;
  function_local = (Function *)stream;
  bVar2 = Loader::Function::isExternal(function);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)function_local,"extern ");
    Loader::getSignature_abi_cxx11_((Loader *)(local_68 + 0x30),local_18);
    poVar7 = std::operator<<(poVar7,(string *)(local_68 + 0x30));
    poVar7 = std::operator<<(poVar7," ");
    Loader::Function::returnType_abi_cxx11_((Function *)local_68);
    poVar7 = std::operator<<(poVar7,(string *)local_68);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 0x30));
  }
  else {
    bVar2 = Loader::Function::isMemberFunction(local_18);
    if (bVar2) {
      std::operator<<((ostream *)function_local,"member ");
    }
    else {
      std::operator<<((ostream *)function_local,"func ");
    }
    pFVar1 = function_local;
    Loader::getSignature_abi_cxx11_(local_88,local_18);
    poVar7 = std::operator<<((ostream *)pFVar1,(string *)local_88);
    poVar7 = std::operator<<(poVar7," ");
    Loader::Function::returnType_abi_cxx11_((Function *)&i);
    poVar7 = std::operator<<(poVar7,(string *)&i);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)local_88);
    poVar7 = std::operator<<((ostream *)function_local,"{");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pFVar1 = function_local;
    attributes = Loader::Function::attributes_abi_cxx11_(local_18);
    generateAttributes((ostream *)pFVar1,attributes);
    pvVar8 = Loader::Function::localTypes_abi_cxx11_(local_18);
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar8);
    if (sVar9 != 0) {
      poVar7 = std::operator<<((ostream *)function_local,"\t.locals ");
      pvVar8 = Loader::Function::localTypes_abi_cxx11_(local_18);
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar8);
      this = (void *)std::ostream::operator<<(poVar7,sVar9);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
      pvVar8 = Loader::Function::localTypes_abi_cxx11_(local_18);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar8);
      local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(pvVar8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&local), bVar2) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3);
        bVar2 = std::operator!=(pbVar10,"");
        if (bVar2) {
          poVar7 = std::operator<<((ostream *)function_local,"\t.local ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(ulong)__range3);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar10);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(__range3->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    this_00 = Loader::Function::instructions(local_18);
    __end2 = std::
             vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
             begin(this_00);
    inst = (Instruction *)
           std::
           vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
           end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_stackjit::Loader::Instruction_*,_std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>_>
                                       *)&inst), bVar2) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_stackjit::Loader::Instruction_*,_std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>_>
                ::operator*(&__end2);
      local_111 = Loader::Instruction::opCode(this_01);
      pmVar11 = std::
                unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at((unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(anonymous_namespace)::opCodeTable_abi_cxx11_,&local_111);
      std::__cxx11::string::string(local_110,(string *)pmVar11);
      local_120._M_current = (char *)std::__cxx11::string::begin();
      local_128._M_current = (char *)std::__cxx11::string::end();
      local_130 = (char *)std::__cxx11::string::begin();
      local_138 = (char *)std::
                          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                    (local_120,local_128,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_130,toupper);
      poVar7 = std::operator<<((ostream *)function_local,"\t");
      std::operator<<(poVar7,local_110);
      IVar3 = Loader::Instruction::format(this_01);
      switch(IVar3) {
      case OpCodeOnly:
        break;
      case IntData:
        poVar7 = std::operator<<((ostream *)function_local," ");
        iVar6 = Loader::Instruction::intValue(this_01);
        std::ostream::operator<<(poVar7,iVar6);
        break;
      case FloatData:
        poVar7 = std::operator<<((ostream *)function_local," ");
        fVar13 = Loader::Instruction::floatValue(this_01);
        std::ostream::operator<<(poVar7,fVar13);
        break;
      case CharData:
        poVar7 = std::operator<<((ostream *)function_local," ");
        cVar4 = Loader::Instruction::charValue(this_01);
        std::ostream::operator<<(poVar7,(int)cVar4);
        break;
      case StringData:
        poVar7 = std::operator<<((ostream *)function_local," ");
        psVar12 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
        std::operator<<(poVar7,(string *)psVar12);
        break;
      case StringConstantData:
        poVar7 = std::operator<<((ostream *)function_local," ");
        psVar12 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
        std::__cxx11::string::string(local_178,(string *)psVar12);
        escapedString(local_158,(string *)local_178);
        std::operator<<(poVar7,(string *)local_158);
        std::__cxx11::string::~string((string *)local_158);
        std::__cxx11::string::~string(local_178);
        break;
      case Call:
        poVar7 = std::operator<<((ostream *)function_local," ");
        psVar12 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
        std::operator<<(poVar7,(string *)psVar12);
        std::operator<<((ostream *)function_local,"(");
        bVar2 = true;
        pvVar8 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
        __end5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar8);
        local_198._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar8);
        while (bVar5 = __gnu_cxx::operator!=(&__end5,&local_198), bVar5) {
          pbVar10 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end5);
          std::__cxx11::string::string(local_1b8,(string *)pbVar10);
          if (bVar2) {
            bVar2 = false;
          }
          else {
            std::operator<<((ostream *)function_local," ");
          }
          std::operator<<((ostream *)function_local,local_1b8);
          std::__cxx11::string::~string(local_1b8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end5);
        }
        std::operator<<((ostream *)function_local,")");
        break;
      case CallInstance:
        poVar7 = std::operator<<((ostream *)function_local," ");
        psVar12 = Loader::Instruction::calledClassType_abi_cxx11_(this_01);
        poVar7 = std::operator<<(poVar7,(string *)psVar12);
        poVar7 = std::operator<<(poVar7,"::");
        psVar12 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
        std::operator<<(poVar7,(string *)psVar12);
        std::operator<<((ostream *)function_local,"(");
        bVar2 = true;
        pvVar8 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
        __end5_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar8);
        local_1d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar8);
        while (bVar5 = __gnu_cxx::operator!=(&__end5_1,&local_1d8), bVar5) {
          pbVar10 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end5_1);
          std::__cxx11::string::string(local_1f8,(string *)pbVar10);
          if (bVar2) {
            bVar2 = false;
          }
          else {
            std::operator<<((ostream *)function_local," ");
          }
          std::operator<<((ostream *)function_local,local_1f8);
          std::__cxx11::string::~string(local_1f8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end5_1);
        }
        std::operator<<((ostream *)function_local,")");
      }
      std::ostream::operator<<(function_local,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_110);
      __gnu_cxx::
      __normal_iterator<const_stackjit::Loader::Instruction_*,_std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>_>
      ::operator++(&__end2);
    }
    poVar7 = std::operator<<((ostream *)function_local,"}");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ByteCodeGenerator::generateFunction(std::ostream& stream, const Loader::Function& function) {
		if (function.isExternal()) {
			stream << "extern " << Loader::getSignature(function) << " " << function.returnType() << std::endl;
		} else {
			if (function.isMemberFunction()) {
				stream << "member ";
			} else {
				stream << "func ";
			}

			stream << Loader::getSignature(function) << " " << function.returnType() << std::endl;

			stream << "{" << std::endl;

			ByteCodeGenerator::generateAttributes(stream, function.attributes());

			if (function.localTypes().size() > 0) {
				stream << "\t.locals " << function.localTypes().size() << std::endl;

				std::size_t i = 0;
				for (auto& local : function.localTypes()) {
					if (local != "") {
						stream << "\t.local " << i << " " << local << std::endl;
					}
					i++;
				}
			}

			for (auto& inst : function.instructions()) {
				auto opCode = opCodeTable.at((unsigned char)inst.opCode());
				std::transform(opCode.begin(), opCode.end(), opCode.begin(), ::toupper);
				stream << "\t" << opCode;

				switch (inst.format()) {
					case Loader::InstructionFormats::OpCodeOnly:
						break;
					case Loader::InstructionFormats::IntData:
						stream << " " << inst.intValue();
						break;
					case Loader::InstructionFormats::FloatData:
						stream << " " << inst.floatValue();
						break;
					case Loader::InstructionFormats::CharData:
						stream << " " << (int)inst.charValue();
						break;
					case Loader::InstructionFormats::StringData:
						stream << " " << inst.stringValue();
						break;
					case Loader::InstructionFormats::StringConstantData:
						stream << " " << escapedString(inst.stringValue());
						break;
					case Loader::InstructionFormats::Call: {
						stream << " " << inst.stringValue();
						stream << "(";
						bool isFirst = true;

						for (auto parameter : inst.callParameters()) {
							if (!isFirst) {
								stream << " ";
							} else {
								isFirst = false;
							}

							stream << parameter;
						}

						stream << ")";
						break;
					}
					case Loader::InstructionFormats::CallInstance: {
						stream << " " << inst.calledClassType() << "::" << inst.stringValue();
						stream << "(";
						bool isFirst = true;

						for (auto parameter : inst.callParameters()) {
							if (!isFirst) {
								stream << " ";
							} else {
								isFirst = false;
							}

							stream << parameter;
						}

						stream << ")";
						break;
					}
				}

				stream << std::endl;
			}

			stream << "}" << std::endl;
		}
	}